

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint32_t regime_el(CPUARMState_conflict *env,ARMMMUIdx mmu_idx)

{
  uint32_t uVar1;
  
  switch(mmu_idx) {
  case ARMMMUIdx_E10_0:
  case ARMMMUIdx_E10_1:
  case ARMMMUIdx_E10_1_PAN:
  case ARMMMUIdx_SE10_1:
  case ARMMMUIdx_SE10_1_PAN:
  case ARMMMUIdx_Stage1_E0:
  case ARMMMUIdx_Stage1_E1:
  case ARMMMUIdx_Stage1_E1_PAN:
  case ARMMMUIdx_MUser:
  case ARMMMUIdx_MPriv:
  case ARMMMUIdx_MUserNegPri:
  case ARMMMUIdx_MPrivNegPri:
  case ARMMMUIdx_MSUser:
  case ARMMMUIdx_MSPriv:
  case ARMMMUIdx_MSUserNegPri:
  case ARMMMUIdx_MSPrivNegPri:
    uVar1 = 1;
    break;
  case ARMMMUIdx_E20_0:
  case ARMMMUIdx_E2:
  case ARMMMUIdx_E20_2:
  case ARMMMUIdx_E20_2_PAN:
  case ARMMMUIdx_Stage2:
    uVar1 = 2;
    break;
  case ARMMMUIdx_SE10_0:
    return (uint)((env->features & 0x10000000) == 0) * 2 + 1;
  case ARMMMUIdx_SE3:
    uVar1 = 3;
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
               ,0x22ef,(char *)0x0);
  }
  return uVar1;
}

Assistant:

static uint32_t regime_el(CPUARMState *env, ARMMMUIdx mmu_idx)
{
    switch (mmu_idx) {
    case ARMMMUIdx_E20_0:
    case ARMMMUIdx_E20_2:
    case ARMMMUIdx_E20_2_PAN:
    case ARMMMUIdx_Stage2:
    case ARMMMUIdx_E2:
        return 2;
    case ARMMMUIdx_SE3:
        return 3;
    case ARMMMUIdx_SE10_0:
        return arm_el_is_aa64(env, 3) ? 1 : 3;
    case ARMMMUIdx_SE10_1:
    case ARMMMUIdx_SE10_1_PAN:
    case ARMMMUIdx_Stage1_E0:
    case ARMMMUIdx_Stage1_E1:
    case ARMMMUIdx_Stage1_E1_PAN:
    case ARMMMUIdx_E10_0:
    case ARMMMUIdx_E10_1:
    case ARMMMUIdx_E10_1_PAN:
    case ARMMMUIdx_MPrivNegPri:
    case ARMMMUIdx_MUserNegPri:
    case ARMMMUIdx_MPriv:
    case ARMMMUIdx_MUser:
    case ARMMMUIdx_MSPrivNegPri:
    case ARMMMUIdx_MSUserNegPri:
    case ARMMMUIdx_MSPriv:
    case ARMMMUIdx_MSUser:
        return 1;
    default:
        g_assert_not_reached();
        // never reach here
        return 1;
    }
}